

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_monitor.cpp
# Opt level: O2

void __thiscall r_exec::SGMonitor::commit(SGMonitor *this)

{
  SimOutcomes *pSVar1;
  bool bVar2;
  Goal *this_00;
  uint64_t now;
  SolutionList *pSVar3;
  _List_node_base *p_Var4;
  double dVar5;
  double dVar6;
  
  this_00 = _Fact::get_goal((_Fact *)(this->super__GMonitor).super_Monitor.target.object);
  now = (*Now)();
  pSVar1 = &(this->super__GMonitor).sim_failures;
  p_Var4 = (_List_node_base *)pSVar1;
  do {
    do {
      p_Var4 = (((SolutionList *)&p_Var4->_M_next)->
               super__List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
               )._M_impl._M_node.super__List_node_base._M_next;
      if ((SimOutcomes *)p_Var4 == pSVar1) {
        pSVar3 = &(this->super__GMonitor).sim_failures.optional_solutions;
        p_Var4 = (_List_node_base *)pSVar3;
        while (p_Var4 = (((_List_base<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>,_std::allocator<std::pair<core::P<r_exec::Goal>,_core::P<r_exec::Sim>_>_>_>
                           *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
              p_Var4 != (_List_node_base *)pSVar3) {
          bVar2 = Sim::is_invalidated((Sim *)p_Var4[1]._M_prev);
          if (!bVar2) {
            dVar5 = Goal::get_strength((Goal *)p_Var4[1]._M_next,now);
            dVar6 = Goal::get_strength(this_00,now);
            if (dVar6 < dVar5) {
              Sim::invalidate((Sim *)p_Var4[1]._M_prev);
            }
          }
        }
        return;
      }
      bVar2 = Sim::is_invalidated(*(Sim **)((long)(p_Var4 + 1) + 8));
    } while (bVar2);
    dVar5 = Goal::get_strength(*(Goal **)(p_Var4 + 1),now);
    dVar6 = Goal::get_strength(this_00,now);
  } while (dVar5 <= dVar6);
  Sim::invalidate(*(Sim **)((long)(p_Var4 + 1) + 8));
  return;
}

Assistant:

void SGMonitor::commit()   // the purpose is to invalidate damaging simulations and let the rest flow upward.
{
    Goal *monitored_goal = target->get_goal();
    uint64_t now = Now();
    SolutionList::const_iterator sol;

    for (sol = sim_failures.mandatory_solutions.begin(); sol != sim_failures.mandatory_solutions.end(); ++sol) { // check if any mandatory solution could result in the failure of more important a goal.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) { // cave in.
            (*sol).second->invalidate();
            return;
        }
    }

    for (sol = sim_failures.optional_solutions.begin(); sol != sim_failures.optional_solutions.end(); ++sol) { // check if any optional solutions could result in the failure of more important a goal; invalidate the culprits.
        if ((*sol).second->is_invalidated()) {
            continue;
        }

        if ((*sol).first->get_strength(now) > monitored_goal->get_strength(now)) {
            (*sol).second->invalidate();
        }
    }
}